

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O3

Error asmjit::v1_14::arm::FormatterInternal::formatRegister
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t rId,uint32_t elementType,uint32_t elementIndex)

{
  uint32_t rId_00;
  byte bVar1;
  char cVar2;
  Error EVar3;
  VirtReg *pVVar4;
  ulong uVar5;
  bool bVar6;
  char *pcVar7;
  BaseEmitter *emitter_00;
  uint uVar8;
  uint32_t rId_01;
  undefined8 uVar9;
  RegType regType_00;
  uint uVar10;
  uint uVar11;
  size_t sStack_30;
  
  uVar5 = (ulong)rId;
  uVar11 = rId - 0x100;
  if (((emitter == (BaseEmitter *)0x0 || 0xfffffefe < uVar11) ||
      (emitter->_emitterType != kCompiler)) || (*(uint *)&emitter[3]._errorHandler <= uVar11)) {
    uVar5 = (ulong)regType;
    uVar11 = (uint)regType;
    uVar10 = uVar11 - 8;
    if (uVar10 < 5) {
      cVar2 = 'v';
      if (elementType == 0) {
        if (uVar10 == 5) goto LAB_0012b7ac;
        cVar2 = "bhsdq"[uVar10];
      }
LAB_0012b71b:
      uVar5 = (ulong)(uint)(int)cVar2;
      pcVar7 = "%c%u";
    }
    else {
      if (uVar11 == 6) {
        cVar2 = 'r';
        if ((arch & k32BitMask) == kUnknown) {
          if (rId == 0x1f) {
            pcVar7 = "wsp";
          }
          else {
            cVar2 = 'w';
            if (rId != 0x3f) goto LAB_0012b71b;
            pcVar7 = "wzr";
          }
LAB_0012b81d:
          sStack_30 = 3;
LAB_0012b830:
          EVar3 = String::_opString(sb,kAppend,pcVar7,sStack_30);
          return EVar3;
        }
        goto LAB_0012b71b;
      }
      if ((uVar11 == 7) && ((arch & k32BitMask) == kUnknown)) {
        if (rId == 0x1f) {
          pcVar7 = "sp";
          sStack_30 = 2;
          goto LAB_0012b830;
        }
        cVar2 = 'x';
        if (rId == 0x3f) {
          pcVar7 = "xzr";
          goto LAB_0012b81d;
        }
        goto LAB_0012b71b;
      }
      pcVar7 = "<Reg-%u>?%u";
    }
    EVar3 = String::_opFormat(sb,kAppend,pcVar7,uVar5);
  }
  else {
    regType_00 = regType;
    pVVar4 = BaseCompiler::virtRegById((BaseCompiler *)emitter,rId);
    if (pVVar4 == (VirtReg *)0x0) {
      formatRegister();
      uVar5 = uVar5 & 0xffffffff;
      uVar9 = 1;
      EVar3 = String::_opChar((String *)emitter,kAppend,'{');
      if (EVar3 == 0) {
        bVar6 = true;
        do {
          do {
            uVar11 = (uint)uVar5;
            if (uVar11 == 0) {
              EVar3 = String::_opChar((String *)emitter,kAppend,'}');
              return EVar3;
            }
            rId_00 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> rId_00 & 1) == 0; rId_00 = rId_00 + 1) {
              }
            }
            uVar11 = 1 << ((byte)rId_00 & 0x1f);
            rId_01 = rId_00 - 1;
            uVar10 = 0;
            do {
              uVar8 = (uint)uVar5 & ~uVar11;
              uVar5 = (ulong)uVar8;
              uVar11 = uVar11 * 2;
              uVar10 = uVar10 + 1;
              rId_01 = rId_01 + 1;
            } while ((uVar8 & uVar11) != 0);
            if ((!bVar6) &&
               (uVar9 = 1,
               EVar3 = String::_opString((String *)emitter,kAppend,", ",0xffffffffffffffff),
               EVar3 != 0)) {
              return EVar3;
            }
            EVar3 = formatRegister((String *)emitter,(FormatFlags)uVar9,emitter_00,arch,regType_00,
                                   rId_00,0,0xffffffff);
            if (EVar3 != 0) {
              return EVar3;
            }
            bVar6 = false;
          } while (uVar10 < 2);
          uVar9 = 1;
          EVar3 = String::_opChar((String *)emitter,kAppend,'-');
          if (EVar3 != 0) {
            return EVar3;
          }
          EVar3 = formatRegister((String *)emitter,(FormatFlags)uVar9,emitter_00,arch,regType_00,
                                 rId_01,0,0xffffffff);
          bVar6 = false;
        } while (EVar3 == 0);
      }
      return EVar3;
    }
    if (*(uint *)(pVVar4 + 0x18) < 0xc) {
      pVVar4 = pVVar4 + 0x1c;
    }
    else {
      pVVar4 = *(VirtReg **)(pVVar4 + 0x20);
    }
    if ((pVVar4 == (VirtReg *)0x0) || (*pVVar4 == (VirtReg)0x0)) {
      EVar3 = String::_opFormat(sb,kAppend,"%%%u",(ulong)uVar11);
    }
    else {
      EVar3 = String::_opString(sb,kAppend,(char *)pVVar4,0xffffffffffffffff);
    }
  }
  if (EVar3 != 0) {
    return EVar3;
  }
  if (elementType != 0) {
    uVar5 = 7;
    if (elementType < 7) {
      uVar5 = (ulong)elementType;
    }
    cVar2 = formatElementDataTable[uVar5 * 4];
    bVar1 = (byte)formatElementDataTable[uVar5 * 4 + 1] >> (regType == kARM_VecD);
    EVar3 = String::_opChar(sb,kAppend,'.');
    if (EVar3 != 0) {
      return EVar3;
    }
    if ((bVar1 != 0) && (EVar3 = String::_opNumber(sb,kAppend,(ulong)bVar1,0,0,kNone), EVar3 != 0))
    {
      return EVar3;
    }
    EVar3 = String::_opChar(sb,kAppend,cVar2);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
LAB_0012b7ac:
  if ((elementIndex == 0xffffffff) ||
     (EVar3 = String::_opFormat(sb,kAppend,"[%u]",(ulong)elementIndex), EVar3 == 0)) {
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t rId,
  uint32_t elementType,
  uint32_t elementIndex) noexcept {

  DebugUtils::unused(flags);
  DebugUtils::unused(arch);

  static const char bhsdq[] = "bhsdq";

  bool virtRegFormatted = false;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(rId)) {
    if (emitter && emitter->isCompiler()) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(rId)) {
        VirtReg* vReg = cc->virtRegById(rId);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(rId))));

        virtRegFormatted = true;
      }
    }
  }
#else
  DebugUtils::unused(emitter, flags);
#endif

  if (!virtRegFormatted) {
    char letter = '\0';
    switch (regType) {
      case RegType::kARM_VecB:
      case RegType::kARM_VecH:
      case RegType::kARM_VecS:
      case RegType::kARM_VecD:
      case RegType::kARM_VecV:
        letter = bhsdq[uint32_t(regType) - uint32_t(RegType::kARM_VecB)];
        if (elementType)
          letter = 'v';
        break;

      case RegType::kARM_GpW:
        if (Environment::is64Bit(arch)) {
          letter = 'w';

          if (rId == a64::Gp::kIdZr)
            return sb.append("wzr", 3);

          if (rId == a64::Gp::kIdSp)
            return sb.append("wsp", 3);
        }
        else {
          letter = 'r';
        }
        break;

      case RegType::kARM_GpX:
        if (Environment::is64Bit(arch)) {
          if (rId == a64::Gp::kIdZr)
            return sb.append("xzr", 3);
          if (rId == a64::Gp::kIdSp)
            return sb.append("sp", 2);

          letter = 'x';
          break;
        }

        // X registers are undefined in 32-bit mode.
        ASMJIT_FALLTHROUGH;

      default:
        ASMJIT_PROPAGATE(sb.appendFormat("<Reg-%u>?%u", uint32_t(regType), rId));
        break;
    }

    if (letter)
      ASMJIT_PROPAGATE(sb.appendFormat("%c%u", letter, rId));
  }

  constexpr uint32_t kElementTypeCount = uint32_t(a64::VecElementType::kMaxValue) + 1;
  if (elementType) {
    elementType = Support::min(elementType, kElementTypeCount);

    FormatElementData elementData = formatElementDataTable[elementType];
    uint32_t elementCount = elementData.elementCount;

    if (regType == RegType::kARM_VecD) {
      elementCount /= 2u;
    }

    ASMJIT_PROPAGATE(sb.append('.'));
    if (elementCount) {
      ASMJIT_PROPAGATE(sb.appendUInt(elementCount));
    }
    ASMJIT_PROPAGATE(sb.append(elementData.letter));
  }

  if (elementIndex != 0xFFFFFFFFu) {
    ASMJIT_PROPAGATE(sb.appendFormat("[%u]", elementIndex));
  }

  return kErrorOk;
}